

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

void __thiscall
ON_PostEffects::GetPostEffects(ON_PostEffects *this,ON_SimpleArray<const_ON_PostEffect_*> *a)

{
  int iVar1;
  ON_SimpleArray<ON_PostEffect_*> *this_00;
  ON_PostEffect **x;
  int local_24;
  int i;
  ON_SimpleArray<ON_PostEffect_*> *pel;
  ON_SimpleArray<const_ON_PostEffect_*> *a_local;
  ON_PostEffects *this_local;
  
  this_00 = CImpl::PostEffectList(this->_impl);
  local_24 = 0;
  while( true ) {
    iVar1 = ON_SimpleArray<ON_PostEffect_*>::Count(this_00);
    if (iVar1 <= local_24) break;
    x = ON_SimpleArray<ON_PostEffect_*>::operator[](this_00,local_24);
    ON_SimpleArray<const_ON_PostEffect_*>::Append(a,x);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void ON_PostEffects::GetPostEffects(ON_SimpleArray<const ON_PostEffect*>& a) const
{
  const auto& pel = _impl->PostEffectList();

  for (int i = 0; i < pel.Count(); i++)
  {
    a.Append(pel[i]);
  }
}